

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_crc32.c
# Opt level: O1

int csp_crc32_verify(csp_packet_t *packet)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = -0x66;
  if (3 < packet->length) {
    csp_id_prepend(packet);
    if (packet->frame_length == 4) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0xffffffff;
      lVar4 = 0;
      do {
        uVar2 = uVar2 >> 8 ^ crc_tab[(byte)(packet->frame_begin[lVar4] ^ (byte)uVar2)];
        lVar4 = lVar4 + 1;
      } while (packet->frame_length - 4 != (int)lVar4);
      uVar2 = ~uVar2;
    }
    uVar1 = packet->length;
    if (*(uint *)(packet->header + (ulong)uVar1 + 4) !=
        (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)) {
      if (uVar1 == 4) {
        uVar2 = 0;
      }
      else {
        uVar2 = 0xffffffff;
        lVar4 = 0;
        do {
          uVar2 = uVar2 >> 8 ^ crc_tab[(byte)(packet->header[lVar4 + 8] ^ (byte)uVar2)];
          lVar4 = lVar4 + 1;
        } while (uVar1 - 4 != (int)lVar4);
        uVar2 = ~uVar2;
      }
      if (*(uint *)(packet->header + (ulong)uVar1 + 4) !=
          (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)) {
        return -0x66;
      }
    }
    packet->length = uVar1 - 4;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int csp_crc32_verify(csp_packet_t * packet) {

	uint32_t crc;

	if (packet->length < sizeof(crc)) {
		return CSP_ERR_CRC32;
	}

	/* Calculate CRC32, convert to network byte order */
	csp_id_prepend(packet);
	crc = csp_crc32_memory(packet->frame_begin, packet->frame_length - sizeof(crc));
	crc = htobe32(crc);

	/* Compare calculated checksum with packet header */
	if (memcmp(&packet->data[packet->length] - sizeof(crc), &crc, sizeof(crc)) != 0) {

		/* CRC32 with header failed, try without header */
		crc = csp_crc32_memory(packet->data, packet->length - sizeof(crc));
		crc = htobe32(crc);

		if (memcmp(&packet->data[packet->length] - sizeof(crc), &crc, sizeof(crc)) != 0) {
			return CSP_ERR_CRC32;
		}
		
	}

	/* Strip CRC32 */
	packet->length -= sizeof(crc);
	return CSP_ERR_NONE;
}